

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-truetype.h
# Opt level: O0

int stbtt__GetGlyphShapeT2(stbtt_fontinfo *info,int glyph_index,stbtt_vertex **pvertices)

{
  int iVar1;
  stbtt_vertex *psVar2;
  undefined1 local_98 [8];
  stbtt__csctx output_ctx;
  stbtt__csctx count_ctx;
  stbtt_vertex **pvertices_local;
  int glyph_index_local;
  stbtt_fontinfo *info_local;
  
  memset(&output_ctx.num_vertices,0,0x38);
  output_ctx.num_vertices = 1;
  memset(local_98,0,0x38);
  iVar1 = stbtt__run_charstring(info,glyph_index,(stbtt__csctx *)&output_ctx.num_vertices);
  if (iVar1 != 0) {
    psVar2 = (stbtt_vertex *)malloc((long)(int)count_ctx.pvertices * 0xe);
    *pvertices = psVar2;
    output_ctx._32_8_ = *pvertices;
    iVar1 = stbtt__run_charstring(info,glyph_index,(stbtt__csctx *)local_98);
    if (iVar1 != 0) {
      if ((int)output_ctx.pvertices == (int)count_ctx.pvertices) {
        return (int)output_ctx.pvertices;
      }
      __assert_fail("output_ctx.num_vertices == count_ctx.num_vertices",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]plutosvg/plutovg/source/plutovg-stb-truetype.h"
                    ,0x8e6,
                    "int stbtt__GetGlyphShapeT2(const stbtt_fontinfo *, int, stbtt_vertex **)");
    }
  }
  *pvertices = (stbtt_vertex *)0x0;
  return 0;
}

Assistant:

static int stbtt__GetGlyphShapeT2(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
   // runs the charstring twice, once to count and once to output (to avoid realloc)
   stbtt__csctx count_ctx = STBTT__CSCTX_INIT(1);
   stbtt__csctx output_ctx = STBTT__CSCTX_INIT(0);
   if (stbtt__run_charstring(info, glyph_index, &count_ctx)) {
      *pvertices = (stbtt_vertex*)STBTT_malloc(count_ctx.num_vertices*sizeof(stbtt_vertex), info->userdata);
      output_ctx.pvertices = *pvertices;
      if (stbtt__run_charstring(info, glyph_index, &output_ctx)) {
         STBTT_assert(output_ctx.num_vertices == count_ctx.num_vertices);
         return output_ctx.num_vertices;
      }
   }
   *pvertices = NULL;
   return 0;
}